

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_GetPropertyForTypeOfScoped<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ImplicitCallFlags IVar1;
  unsigned_short localRegisterID;
  ushort uVar2;
  ThreadContext *this_00;
  ScriptContext *requestContext;
  FunctionBody *functionBody;
  bool bVar3;
  PropertyId PVar4;
  FrameDisplay *pFVar5;
  InlineCache *pIVar6;
  void *object;
  Var pvVar7;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  Var value;
  
  this_00 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar1 = this_00->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_00);
  PVar4 = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  pFVar5 = GetEnvForEvalCode(this);
  pIVar6 = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  if (pFVar5->length == 1) {
    requestContext = *(ScriptContext **)(this + 0x78);
    object = FrameDisplay::GetItem(pFVar5,0);
    local_90 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_90,*(FunctionBody **)(this + 0x88),pIVar6,
               (uint)playout->inlineCacheIndex,true);
    bVar3 = CacheOperators::
            TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                      (object,false,(RecyclableObject *)object,PVar4,(Var *)&info.inlineCacheIndex,
                       requestContext,(PropertyCacheOperationInfo *)0x0,
                       (PropertyValueInfo *)local_90);
    if (bVar3) {
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
      this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
      SetReg<unsigned_short>(this,playout->Value,(Var)info._56_8_);
      return;
    }
  }
  localRegisterID = playout->Value;
  functionBody = *(FunctionBody **)(this + 0x88);
  pIVar6 = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  uVar2 = playout->inlineCacheIndex;
  pFVar5 = GetEnvForEvalCode(this);
  PVar4 = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  pvVar7 = GetReg<unsigned_int>(this,1);
  pvVar7 = JavascriptOperators::PatchGetPropertyForTypeOfScoped<false,Js::InlineCache>
                     (functionBody,pIVar6,(uint)uVar2,pFVar5,PVar4,pvVar7);
  SetReg<unsigned_short>(this,localRegisterID,pvVar7);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetPropertyForTypeOfScoped(const unaligned OpLayoutT_ElementP<T>* playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Get the property, using a scope stack rather than an individual instance.
        // Use the cache
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        FrameDisplay *pScope = this->GetEnvForEvalCode();
        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);
        ScriptContext* scriptContext = GetScriptContext();
        int length = pScope->GetLength();
        if (1 == length)
        {
            DynamicObject *obj = (DynamicObject*)pScope->GetItem(0);
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &value, scriptContext, nullptr, &info))
            {
                threadContext->CheckAndResetImplicitCallAccessorFlag();
                threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

                SetReg(playout->Value, value);
                return;
            }
        }

        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetPropertyForTypeOfScoped<false>(
                GetFunctionBody(),
                GetInlineCache(playout->inlineCacheIndex),
                playout->inlineCacheIndex,
                GetEnvForEvalCode(),
                GetPropertyIdFromCacheId(playout->inlineCacheIndex),
                GetReg(Js::FunctionBody::RootObjectRegSlot)));

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }